

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O0

bool helics::isIgnoreableCommand(ActionMessage *command)

{
  bool bVar1;
  action_t aVar2;
  ActionMessage *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = isDisconnectCommand((ActionMessage *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar1 = isErrorCommand((ActionMessage *)
                           CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (bVar1) {
      bVar1 = true;
    }
    else {
      aVar2 = ActionMessage::action(in_RDI);
      if ((((aVar2 == cmd_request_current_time) || (aVar2 == cmd_log)) ||
          (aVar2 == cmd_time_request)) || ((aVar2 == cmd_remote_log || (aVar2 == cmd_warning)))) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
  }
  return bVar1;
}

Assistant:

inline bool isIgnoreableCommand(const ActionMessage& command) noexcept
{
    if (isDisconnectCommand(command)) {
        return true;
    }
    if (isErrorCommand(command)) {
        return true;
    }
    switch (command.action()) {
        case CMD_LOG:
        case CMD_WARNING:
        case CMD_REMOTE_LOG:
        case CMD_TIME_REQUEST:
        case CMD_REQUEST_CURRENT_TIME:
            return true;
        default:
            return false;
    }
}